

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  ContextWrapper *this_00;
  ReferenceContext *this_01;
  int iVar1;
  RenderContext *context;
  TestLog *log;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_02;
  NotSupportedError *this_03;
  int height;
  ReferenceContext *pRVar6;
  int width;
  Random rnd;
  ReferenceContextBuffers refBuffers;
  GLContext gles2Context;
  ReferenceContext refContext;
  PixelBufferAccess local_64d0;
  deRandom local_64a8;
  ReferenceContextLimits local_6498;
  ReferenceContextBuffers local_6440;
  MultisamplePixelBufferAccess local_63c8;
  MultisamplePixelBufferAccess local_63a0;
  MultisamplePixelBufferAccess local_6378;
  undefined1 local_6350 [368];
  ReferenceContext local_61e0;
  int *piVar5;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[4])();
  piVar5 = (int *)CONCAT44(extraout_var,iVar2);
  if ((this->m_width <= *piVar5) && (this->m_height <= piVar5[1])) {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                         _M_p);
    deRandom_init(&local_64a8,dVar3);
    iVar2 = *piVar5;
    width = 0x100;
    if (iVar2 < 0x100) {
      width = iVar2;
    }
    height = 0x100;
    if (piVar5[1] < 0x100) {
      height = piVar5[1];
    }
    dVar3 = deRandom_getUint32(&local_64a8);
    iVar1 = piVar5[1];
    dVar4 = deRandom_getUint32(&local_64a8);
    local_61e0.super_Context._vptr_Context =
         (_func_int **)CONCAT44(dVar4 % ((iVar1 - height) + 1U),dVar3 % ((iVar2 - width) + 1U));
    local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)width;
    local_61e0.super_Context._12_4_ = height;
    sglr::GLContext::GLContext((GLContext *)local_6350,context,log,1,(IVec4 *)(local_6350 + 0x170));
    local_61e0.super_Context._12_4_ = (uint)(piVar5[5] != 0) << 3;
    local_61e0.super_Context._vptr_Context = (_func_int **)0x800000008;
    local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
    sglr::ReferenceContextBuffers::ReferenceContextBuffers
              (&local_6440,(PixelFormat *)(local_6350 + 0x170),0,0,width,height,1);
    sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6498,context);
    tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_colorbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
    tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_depthbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
    tcu::TextureLevel::getAccess(&local_64d0,&local_6440.m_stencilbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_64d0);
    this_01 = (ReferenceContext *)(local_6350 + 0x170);
    sglr::ReferenceContext::ReferenceContext
              (this_01,&local_6498,&local_6378,&local_63a0,&local_63c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6498.extensionStr._M_dataplus._M_p != &local_6498.extensionStr.field_2) {
      operator_delete(local_6498.extensionStr._M_dataplus._M_p,
                      local_6498.extensionStr.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6498.extensionList);
    this_00 = &this->super_ContextWrapper;
    iVar2 = 1;
    do {
      pRVar6 = this_01;
      if (iVar2 == 1) {
        pRVar6 = (ReferenceContext *)local_6350;
      }
      sglr::ContextWrapper::setContext(this_00,&pRVar6->super_Context);
      sglr::ContextWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
      sglr::ContextWrapper::glClear(this_00,0x4500);
      iVar2 = iVar2 + -1;
    } while (iVar2 == 0);
    iVar2 = 1;
    while( true ) {
      pRVar6 = this_01;
      if (iVar2 == 1) {
        pRVar6 = (ReferenceContext *)local_6350;
      }
      sglr::ContextWrapper::setContext(this_00,&pRVar6->super_Context);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
      dVar3 = sglr::ContextWrapper::glGetError(this_00);
      if (dVar3 != 0) break;
      iVar2 = iVar2 + -1;
      if (iVar2 != 0) {
        iVar2 = 1;
        do {
          pRVar6 = this_01;
          if (iVar2 == 1) {
            pRVar6 = (ReferenceContext *)local_6350;
          }
          sglr::ContextWrapper::setContext(this_00,&pRVar6->super_Context);
          dVar3 = 0x8513;
          if (this->m_texType == TEXTURETYPE_2D) {
            dVar3 = 0xde1;
          }
          sglr::ContextWrapper::glTexParameteri
                    (this_00,dVar3,0x2801,(this->m_flags & 1 | 0x26) << 8);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar3,0x2800,0x2600);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar3,0x2802,0x812f);
          sglr::ContextWrapper::glTexParameteri(this_00,dVar3,0x2803,0x812f);
          iVar2 = iVar2 + -1;
        } while (iVar2 == 0);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        sglr::GLContext::enableLogging((GLContext *)local_6350,0);
        if (this->m_texType == TEXTURETYPE_2D) {
          verifyTex2D(this,(GLContext *)local_6350,(ReferenceContext *)(local_6350 + 0x170));
        }
        else if (this->m_texType == TEXTURETYPE_CUBE) {
          verifyTexCube(this,(GLContext *)local_6350,(ReferenceContext *)(local_6350 + 0x170));
        }
        sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)(local_6350 + 0x170));
        tcu::TextureLevel::~TextureLevel(&local_6440.m_stencilbuffer);
        tcu::TextureLevel::~TextureLevel(&local_6440.m_depthbuffer);
        tcu::TextureLevel::~TextureLevel(&local_6440.m_colorbuffer);
        sglr::GLContext::~GLContext((GLContext *)local_6350);
        return STOP;
      }
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,(char *)0x0,"glGetError() == GL_NO_ERROR",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
               ,0x1bf);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_03,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x1a4);
  __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	DE_ASSERT(m_width <= 256 && m_height <= 256);
	if (renderTarget.getWidth() < m_width || renderTarget.getHeight() < m_height)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES2
	de::Random		rnd			(deStringHash(getName()));
	int				width		= deMin32(renderTarget.getWidth(),	256);
	int				height		= deMin32(renderTarget.getHeight(),	256);
	int				x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int				y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles2Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES2 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Setup texture filtering state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);

		deUint32 texTarget = m_texType == TEXTURETYPE_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
		glTexParameteri(texTarget, GL_TEXTURE_MIN_FILTER,	(m_flags & MIPMAPS) ? GL_NEAREST_MIPMAP_NEAREST : GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles2Context.enableLogging(0);

	// Verify results.
	switch (m_texType)
	{
		case TEXTURETYPE_2D:	verifyTex2D		(gles2Context, refContext);	break;
		case TEXTURETYPE_CUBE:	verifyTexCube	(gles2Context, refContext);	break;
		default:
			DE_ASSERT(false);
	}

	return STOP;
}